

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char local_58 [8];
  char str [50];
  uint32_t local_1c;
  char **ppcStack_18;
  uint32_t num;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    printf("Please input a number: ");
    pcVar2 = fgets(local_58,0x32,_stdin);
    if (pcVar2 == (char *)0x0) {
      printf("\n");
      return 0;
    }
    iVar1 = __isoc99_sscanf(local_58,"%u",&local_1c);
    if (iVar1 != 0) break;
    printf("Invalid number!\n");
  }
  decompose(local_1c);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  uint32_t num;

  while (true) {
    printf("Please input a number: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%" SCNu32, &num)) break;
    else printf("Invalid number!\n");
  }

  decompose(num);
}